

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property.cpp
# Opt level: O0

bool __thiscall QMakeProperty::hasValue(QMakeProperty *this,ProKey *v)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  ProKey *in_stack_ffffffffffffffc8;
  QMakeProperty *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  value(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  bVar2 = ProString::isNull((ProString *)0x334981);
  ProString::~ProString((ProString *)0x334990);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return !bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool
QMakeProperty::hasValue(const ProKey &v)
{
    return !value(v).isNull();
}